

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int on_ack_data_blocked(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,
                       quicly_sent_t *sent)

{
  if (map[2].num_packets == (sent->data).packet.packet_number) {
    if (acked == 0) {
      if (((packet->field_0x11 & 2) != 0) && (*(int *)&map[9]._pending_packet == 2)) {
        *(undefined4 *)&map[9]._pending_packet = 1;
      }
    }
    else {
      *(undefined4 *)&map[9]._pending_packet = 3;
    }
  }
  return 0;
}

Assistant:

static int on_ack_data_blocked(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));

    if (conn->egress.max_data.permitted == sent->data.data_blocked.offset) {
        if (acked) {
            conn->egress.data_blocked = QUICLY_SENDER_STATE_ACKED;
        } else if (packet->frames_in_flight && conn->egress.data_blocked == QUICLY_SENDER_STATE_UNACKED) {
            conn->egress.data_blocked = QUICLY_SENDER_STATE_SEND;
        }
    }

    return 0;
}